

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O0

void __thiscall tt::Logger::~Logger(Logger *this)

{
  int len;
  LogStream *pLVar1;
  Buffer *this_00;
  char *msg;
  Buffer *buf;
  Logger *this_local;
  
  pLVar1 = LogStream::operator<<((LogStream *)this,"--");
  pLVar1 = LogStream::operator<<(pLVar1,&(this->m_impl).m_basename);
  pLVar1 = LogStream::operator<<(pLVar1," : ");
  pLVar1 = LogStream::operator<<(pLVar1,(this->m_impl).m_line);
  LogStream::operator<<(pLVar1,"\n");
  pLVar1 = stream(this);
  this_00 = LogStream::buffer(pLVar1);
  msg = detail::FixedBuffer<4000>::data(this_00);
  len = detail::FixedBuffer<4000>::length(this_00);
  output(msg,len);
  Impl::~Impl(&this->m_impl);
  return;
}

Assistant:

Logger::~Logger(){
	
	m_impl.m_stream << "--" << m_impl.m_basename << " : " 
		<< m_impl.m_line << "\n";
	
	const LogStream::Buffer& buf(stream().buffer());

	output(buf.data(), buf.length());
}